

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O3

TemporalBinInfo *
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_2UL>
::TemporalBinInfo::merge2(TemporalBinInfo *a,TemporalBinInfo *b)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  size_t sVar8;
  TemporalBinInfo *r;
  TemporalBinInfo *in_RDI;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  
  sVar8 = a->count1[0];
  in_RDI->count0[0] = a->count0[0];
  in_RDI->count1[0] = sVar8;
  aVar9 = a->bounds0[0].bounds0.lower.field_0;
  aVar1 = a->bounds0[0].bounds0.upper.field_0;
  aVar2 = a->bounds0[0].bounds1.lower.field_0;
  aVar3 = a->bounds0[0].bounds1.upper.field_0;
  aVar4 = a->bounds1[0].bounds0.lower.field_0;
  aVar5 = a->bounds1[0].bounds0.upper.field_0;
  aVar6 = a->bounds1[0].bounds1.lower.field_0;
  sVar8 = b->count1[0];
  aVar7 = a->bounds1[0].bounds1.upper.field_0;
  in_RDI->count0[0] = in_RDI->count0[0] + b->count0[0];
  in_RDI->count1[0] = in_RDI->count1[0] + sVar8;
  aVar9.m128 = (__m128)minps(aVar9.m128,b->bounds0[0].bounds0.lower.field_0);
  in_RDI->bounds0[0].bounds0.lower.field_0 = aVar9;
  aVar9.m128 = (__m128)maxps(aVar1.m128,b->bounds0[0].bounds0.upper.field_0);
  in_RDI->bounds0[0].bounds0.upper.field_0 = aVar9;
  aVar9.m128 = (__m128)minps(aVar2.m128,b->bounds0[0].bounds1.lower.field_0);
  in_RDI->bounds0[0].bounds1.lower.field_0 = aVar9;
  aVar9.m128 = (__m128)maxps(aVar3.m128,b->bounds0[0].bounds1.upper.field_0);
  in_RDI->bounds0[0].bounds1.upper.field_0 = aVar9;
  aVar9.m128 = (__m128)minps(aVar4.m128,b->bounds1[0].bounds0.lower.field_0);
  in_RDI->bounds1[0].bounds0.lower.field_0 = aVar9;
  aVar9.m128 = (__m128)maxps(aVar5.m128,b->bounds1[0].bounds0.upper.field_0);
  in_RDI->bounds1[0].bounds0.upper.field_0 = aVar9;
  aVar9.m128 = (__m128)minps(aVar6.m128,b->bounds1[0].bounds1.lower.field_0);
  in_RDI->bounds1[0].bounds1.lower.field_0 = aVar9;
  aVar9.m128 = (__m128)maxps(aVar7.m128,b->bounds1[0].bounds1.upper.field_0);
  in_RDI->bounds1[0].bounds1.upper.field_0 = aVar9;
  return in_RDI;
}

Assistant:

static __forceinline const TemporalBinInfo merge2(const TemporalBinInfo& a, const TemporalBinInfo& b) {
            TemporalBinInfo r = a; r.merge(b); return r;
          }